

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::PointSourcePannerDownmix::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          PointSourcePannerDownmix *this,Vector3d *position)

{
  element_type *peVar1;
  LhsNested LVar2;
  DenseStorage<double,__1,__1,_1,_0> *other;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> pv;
  DenseStorage<double,__1,__1,_1,_0> local_78;
  optional_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_68;
  MatrixXd *local_50;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  double local_28;
  
  peVar1 = (this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_28 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  local_38 = *(undefined4 *)
              (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array;
  uStack_34 = *(undefined4 *)
               ((long)(position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array + 4);
  uStack_30 = *(undefined4 *)
               ((position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                m_data.array + 1);
  uStack_2c = *(undefined4 *)
               ((long)(position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data.array + 0xc);
  (**peVar1->_vptr_PointSourcePanner)(&local_68,peVar1,&local_38);
  if (local_68.m_initialized == true) {
    other = (DenseStorage<double,__1,__1,_1,_0> *)
            boost::optional<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::get
                      ((optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_68);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_78,other);
    local_50 = &this->_downmix;
    local_48 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>> *)
                          &local_50,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_78
                         );
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_78,&local_48);
    LVar2.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                   ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_78);
    local_48.m_lhs.m_matrix = LVar2.m_matrix;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator/=
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_78,(Scalar *)&local_48);
    (__return_storage_ptr__->super_type).m_storage.dummy_.aligner_ = (type)local_78.m_data;
    *(Index *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 8) = local_78.m_rows;
    (__return_storage_ptr__->super_type).m_initialized = true;
  }
  else {
    (__return_storage_ptr__->super_type).m_initialized = false;
  }
  boost::optional_detail::optional_base<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~optional_base
            (&local_68);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> PointSourcePannerDownmix::handle(
      Eigen::Vector3d position) {
    boost::optional<Eigen::VectorXd> pv = _psp->handle(position);
    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      _pv = _downmix.transpose() * _pv;
      _pv /= _pv.norm();
      return _pv;
    }
    return boost::none;
  }